

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGather2DCase::verify
          (TextureGather2DCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  ostringstream *stream;
  ostringstream *this_00;
  GatherType gatherType;
  TextureType TVar1;
  ChannelOrder CVar2;
  ChannelType CVar3;
  int this_01 [2];
  Vector<float,_2> VVar4;
  PixelOffsets *pPVar5;
  bool bVar6;
  undefined7 extraout_var;
  MessageBuilder *this_02;
  ulong uVar7;
  _anonymous_namespace_ *__n;
  Surface *pSVar8;
  ConstPixelBufferAccess *pCVar9;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  void *__buf_11;
  void *__buf_12;
  void *__buf_13;
  void *__buf_14;
  uint uVar10;
  float fVar11;
  int __fd;
  Vector<int,_4> *a;
  int px;
  float fVar12;
  int px_3;
  GatherArgs *gatherArgs;
  float fVar13;
  allocator<char> local_46e;
  allocator<char> local_46d;
  float local_46c;
  Vector<bool,_4> local_468;
  Vector<bool,_4> local_464;
  uint local_460;
  float local_45c;
  float local_458;
  float local_454;
  ConstPixelBufferAccess *local_450;
  Vector<float,_2> texCoord;
  string local_428;
  Surface ideal;
  IVec3 uvwBits;
  IVec3 coordBits;
  Surface errorMask;
  Surface errorMask_1;
  Vec2 viewportCoord;
  undefined1 local_360 [16];
  TexComparePrecision comparePrec;
  PixelBufferAccess idealAccess;
  Vector<bool,_4> local_2f8 [2];
  Vec4 idealPix;
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
  local_2c8;
  Vec4 resultPix;
  Vec4 refColor;
  IVec2 offsets [4];
  Vec2 texCoords [4];
  IVec4 colorBits;
  
  texCoords[2].m_data[0] = 0.0;
  texCoords[2].m_data[1] = 0.0;
  texCoords[3].m_data[0] = 0.0;
  texCoords[3].m_data[1] = 0.0;
  texCoords[0].m_data[0] = 0.0;
  texCoords[0].m_data[1] = 0.0;
  texCoords[1].m_data[0] = 0.0;
  texCoords[1].m_data[1] = 0.0;
  (*(this->super_TextureGatherCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[9])
            ((_Vector_base<float,_std::allocator<float>_> *)offsets,this,(ulong)ctx & 0xffffffff);
  computeTexCoordVecs<2>((vector<float,_std::allocator<float>_> *)offsets,&texCoords);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)offsets);
  local_360._8_8_ =
       (this->m_swizzledTexture).m_view.m_levels + (this->super_TextureGatherCase).m_baseLevel;
  local_360._0_4_ = CLAMP_TO_BORDER;
  this_01 = (int  [2])
            ((this->super_TextureGatherCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
            ->m_log;
  gatherArgs = (this->m_iterations).
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
               ._M_impl.super__Vector_impl_data._M_start + (int)ctx;
  if (((this->super_TextureGatherCase).m_flags & 1) != 0) {
    uVar7 = 0;
    if (0 < gatherArgs->componentNdx) {
      uVar7 = (ulong)(uint)gatherArgs->componentNdx;
    }
    resultPix.m_data[0] = 0.0;
    resultPix.m_data[1] = 0.0;
    resultPix.m_data[2] = 0.0;
    resultPix.m_data[3] = 1.0;
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&refColor,resultPix.m_data[uVar7]);
    bVar6 = verifySingleColored((anon_unknown_0 *)this_01,(TestLog *)sig,
                                (ConstPixelBufferAccess *)&refColor,(Vec4 *)siglen);
    uVar10 = (uint)CONCAT71(extraout_var,bVar6);
    if (!bVar6) {
      this_00 = (ostringstream *)(offsets + 1);
      offsets[0].m_data = this_01;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,"Note: expected color ");
      tcu::operator<<((ostream *)this_00,&refColor);
      std::operator<<((ostream *)this_00," for all pixels; ");
      this_02 = tcu::MessageBuilder::operator<<((MessageBuilder *)offsets,resultPix.m_data + uVar7);
      stream = &this_02->m_str;
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      " is component at index ");
      std::ostream::operator<<(stream,(int)uVar7);
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>," in the color ");
      tcu::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,&resultPix);
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      ", which is used for incomplete textures");
      tcu::MessageBuilder::operator<<(this_02,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
    }
    goto LAB_0137488c;
  }
  gatherType = (this->super_TextureGatherCase).m_gatherType;
  local_450 = (ConstPixelBufferAccess *)sig;
  TextureGatherCase::getOffsetRange((TextureGatherCase *)offsets);
  makePixelOffsetsFunctor(&local_2c8,gatherType,gatherArgs,offsets);
  resultPix.m_data[0] = 1.12104e-44;
  resultPix.m_data[1] = 1.12104e-44;
  resultPix.m_data[2] = 1.12104e-44;
  resultPix.m_data[3] = 1.12104e-44;
  tcu::operator-((tcu *)offsets,(Vector<int,_4> *)&resultPix,1);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&refColor,0);
  a = (Vector<int,_4> *)offsets;
  tcu::max<int,4>((tcu *)&colorBits,a,(Vector<int,_4> *)&refColor);
  TVar1 = (this->super_TextureGatherCase).m_textureType;
  if (TVar1 == TEXTURETYPE_2D_ARRAY) {
    coordBits.m_data[0] = 0x14;
    coordBits.m_data[1] = 0x14;
    coordBits.m_data[2] = 0x14;
LAB_013736e1:
    uvwBits.m_data[0] = 7;
    uvwBits.m_data[1] = 7;
    uvwBits.m_data[2] = 7;
  }
  else {
    if (TVar1 == TEXTURETYPE_CUBE) {
      coordBits.m_data[0] = 10;
      coordBits.m_data[1] = 10;
      coordBits.m_data[2] = 10;
LAB_013736b2:
      uvwBits.m_data[0] = 6;
      uvwBits.m_data[1] = 6;
    }
    else {
      if (TVar1 != TEXTURETYPE_2D) {
        a = (Vector<int,_4> *)0xffffffffffffffff;
        tcu::Vector<int,_3>::Vector(&coordBits,-1);
        TVar1 = (this->super_TextureGatherCase).m_textureType;
        if (TVar1 == TEXTURETYPE_2D_ARRAY) goto LAB_013736e1;
        if (TVar1 == TEXTURETYPE_CUBE) goto LAB_013736b2;
        if (TVar1 == TEXTURETYPE_2D) goto LAB_0137357a;
        a = (Vector<int,_4> *)0xffffffffffffffff;
        tcu::Vector<int,_3>::Vector(&uvwBits,-1);
        goto LAB_013736f4;
      }
      coordBits.m_data[0] = 0x14;
      coordBits.m_data[1] = 0x14;
      coordBits.m_data[2] = 0;
LAB_0137357a:
      uvwBits.m_data[0] = 7;
      uvwBits.m_data[1] = 7;
    }
    uvwBits.m_data[2] = 0;
  }
LAB_013736f4:
  refColor.m_data[2] = 9.80909e-45;
  refColor.m_data[3] = 8.40779e-45;
  refColor.m_data[0] = (float)(this->super_TextureGatherCase).m_wrapS;
  refColor.m_data[1] = (float)(this->super_TextureGatherCase).m_wrapT;
  CVar2 = (this->super_TextureGatherCase).m_textureFormat.order;
  __fd = this_01[0];
  if ((CVar2 == DS) || (CVar2 == D)) {
    tcu::TexComparePrecision::TexComparePrecision(&comparePrec);
    comparePrec.coordBits.m_data[2] = coordBits.m_data[2];
    comparePrec.coordBits.m_data[0] = coordBits.m_data[0];
    comparePrec.coordBits.m_data[1] = coordBits.m_data[1];
    comparePrec.uvwBits.m_data[0] = uvwBits.m_data[0];
    comparePrec.uvwBits.m_data[1] = uvwBits.m_data[1];
    comparePrec.uvwBits.m_data[2] = uvwBits.m_data[2];
    comparePrec.referenceBits = 0x10;
    comparePrec.resultBits = 7;
    PixelCompareRefZDefault::PixelCompareRefZDefault
              ((PixelCompareRefZDefault *)&errorMask_1,(IVec2 *)a);
    pPVar5 = local_2c8.
             super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
             .m_data.ptr;
    local_46c = (float)(local_450->m_size).m_data[0];
    tcu::Surface::Surface(&ideal,(int)local_46c,(int)local_46c);
    tcu::Surface::getAccess(&idealAccess,&ideal);
    tcu::Surface::Surface(&errorMask,(int)local_46c,(int)local_46c);
    tcu::Surface::getAccess((PixelBufferAccess *)offsets,&errorMask);
    idealPix.m_data[0] = -1.7146522e+38;
    tcu::RGBA::toVec((RGBA *)&idealPix);
    tcu::clear((PixelBufferAccess *)offsets,&resultPix);
    local_458 = (float)(int)local_46c;
    fVar11 = 0.0;
    __n = (_anonymous_namespace_ *)0x0;
    if (0 < (int)local_46c) {
      __n = (_anonymous_namespace_ *)(ulong)(uint)local_46c;
    }
    fVar13 = SUB84(__n,0);
    local_460 = (uint)CONCAT71((uint7)(uint3)((uint)local_46c >> 8),1);
    for (; fVar11 != fVar13; fVar11 = (float)((int)fVar11 + 1)) {
      local_454 = (float)(int)fVar11;
      for (fVar12 = 0.0; local_46c != fVar12; fVar12 = (float)((int)fVar12 + 1)) {
        offsets[2].m_data[0] = 0;
        offsets[2].m_data[1] = 0;
        offsets[3].m_data[0] = 0;
        offsets[3].m_data[1] = 0;
        offsets[0].m_data[0] = 0;
        offsets[0].m_data[1] = 0;
        offsets[1].m_data[0] = 0;
        offsets[1].m_data[1] = 0;
        resultPix.m_data[1] = fVar11;
        resultPix.m_data[0] = fVar12;
        (**pPVar5->_vptr_PixelOffsets)(pPVar5,(ConstPixelBufferAccess *)&resultPix,offsets);
        idealPix.m_data[0] = (float)(int)fVar12;
        idealPix.m_data[1] = local_454;
        tcu::operator+(0.5,(Vector<float,_2> *)&idealPix);
        texCoord.m_data[0] = local_458;
        texCoord.m_data[1] = local_458;
        tcu::operator/((Vector<float,_2> *)&resultPix,&texCoord);
        VVar4 = Functional::(anonymous_namespace)::triQuadInterpolate<tcu::Vector<float,2>>
                          ((_anonymous_namespace_ *)&texCoord,&texCoords,viewportCoord.m_data[0],
                           viewportCoord.m_data[1]);
        local_45c = (float)(**(code **)CONCAT44(errorMask_1.m_height,errorMask_1.m_width))
                                     (VVar4.m_data[0],&errorMask_1,
                                      (ConstPixelBufferAccess *)&resultPix);
        tcu::ConstPixelBufferAccess::getPixel
                  ((ConstPixelBufferAccess *)&resultPix,(int)local_450,(int)fVar12,(int)fVar11);
        tcu::Texture2DView::gatherOffsetsCompare
                  ((Texture2DView *)&idealPix,(Sampler *)local_360,local_45c,texCoord.m_data[0],
                   texCoord.m_data[1],(IVec2 (*) [4])&refColor);
        __n = (_anonymous_namespace_ *)(ulong)(uint)fVar11;
        tcu::PixelBufferAccess::setPixel(&idealAccess,&idealPix,(int)fVar12,(int)fVar11,0);
        tcu::equal<float,4>((tcu *)&local_428,(Vector<float,_4> *)&resultPix,
                            (Vector<float,_4> *)&idealPix);
        bVar6 = tcu::boolAll<4>((Vector<bool,_4> *)&local_428);
        if ((!bVar6) &&
           (__n = (_anonymous_namespace_ *)&texCoord,
           bVar6 = tcu::isGatherOffsetsCompareResultValid
                             ((Texture2DView *)local_360,(Sampler *)&refColor,&comparePrec,
                              (Vec2 *)&texCoord,&offsets,local_45c,&resultPix), !bVar6)) {
          *(undefined4 *)
           ((long)errorMask.m_pixels.m_ptr +
           (long)(errorMask.m_width * (int)fVar11 + (int)fVar12) * 4) = 0xff0000ff;
          local_460 = 0;
          __n = (_anonymous_namespace_ *)errorMask.m_pixels.m_ptr;
        }
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&idealPix,"VerifyResult",(allocator<char> *)&local_464);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&viewportCoord,"Verification result",(allocator<char> *)&local_468);
    uVar10 = local_460;
    tcu::LogImageSet::LogImageSet
              ((LogImageSet *)&resultPix,(string *)&idealPix,(string *)&viewportCoord);
    tcu::LogImageSet::write((LogImageSet *)&resultPix,__fd,__buf,(size_t)__n);
    std::__cxx11::string::string<std::allocator<char>>((string *)&texCoord,"Rendered",&local_46e);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_428,"Rendered image",&local_46d);
    pCVar9 = local_450;
    tcu::LogImage::LogImage
              ((LogImage *)offsets,(string *)&texCoord,&local_428,local_450,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)offsets,__fd,__buf_00,(size_t)pCVar9);
    tcu::LogImage::~LogImage((LogImage *)offsets);
    std::__cxx11::string::~string((string *)&local_428);
    std::__cxx11::string::~string((string *)&texCoord);
    tcu::LogImageSet::~LogImageSet((LogImageSet *)&resultPix);
    std::__cxx11::string::~string((string *)&viewportCoord);
    std::__cxx11::string::~string((string *)&idealPix);
    if ((uVar10 & 1) == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&idealPix,"Reference",(allocator<char> *)&local_464);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&viewportCoord,"Ideal reference image",(allocator<char> *)&local_468);
      pSVar8 = &ideal;
      tcu::LogImage::LogImage
                ((LogImage *)offsets,(string *)&idealPix,(string *)&viewportCoord,pSVar8,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)offsets,__fd,__buf_01,(size_t)pSVar8);
      std::__cxx11::string::string<std::allocator<char>>((string *)&texCoord,"ErrorMask",&local_46e)
      ;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_428,"Error mask",&local_46d);
      pSVar8 = &errorMask;
      tcu::LogImage::LogImage
                ((LogImage *)&resultPix,(string *)&texCoord,&local_428,pSVar8,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)&resultPix,__fd,__buf_02,(size_t)pSVar8);
      tcu::LogImage::~LogImage((LogImage *)&resultPix);
      std::__cxx11::string::~string((string *)&local_428);
      std::__cxx11::string::~string((string *)&texCoord);
      tcu::LogImage::~LogImage((LogImage *)offsets);
      std::__cxx11::string::~string((string *)&viewportCoord);
      std::__cxx11::string::~string((string *)&idealPix);
    }
    tcu::TestLog::endImageSet((TestLog *)this_01);
    tcu::Surface::~Surface(&errorMask);
    tcu::Surface::~Surface(&ideal);
  }
  else {
    local_45c = 0.0;
    if (0 < gatherArgs->componentNdx) {
      local_45c = (float)gatherArgs->componentNdx;
    }
    CVar3 = (this->super_TextureGatherCase).m_textureFormat.type;
    uVar7 = (ulong)CVar3;
    if (uVar7 < 0x22) {
      if ((0x58UL >> (uVar7 & 0x3f) & 1) == 0) {
        if ((0x2c0000000U >> (uVar7 & 0x3f) & 1) == 0) goto LAB_013748a4;
        goto LAB_01373d03;
      }
      tcu::LookupPrecision::LookupPrecision((LookupPrecision *)&idealAccess);
      pCVar9 = local_450;
      tcu::computeFixedPointThreshold((tcu *)offsets,&colorBits);
      pPVar5 = local_2c8.
               super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
               .m_data.ptr;
      idealAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] = offsets[0].m_data[0];
      idealAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] = offsets[0].m_data[1];
      idealAccess.super_ConstPixelBufferAccess.m_data = (void *)offsets[1].m_data;
      idealAccess.super_ConstPixelBufferAccess.m_format.order = coordBits.m_data[0];
      idealAccess.super_ConstPixelBufferAccess.m_format.type = coordBits.m_data[1];
      idealAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = coordBits.m_data[2];
      idealAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = uvwBits.m_data[0];
      idealAccess.super_ConstPixelBufferAccess.m_size.m_data[2] = uvwBits.m_data[1];
      idealAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] = uvwBits.m_data[2];
      local_2f8[0].m_data[0] = true;
      local_2f8[0].m_data[1] = true;
      local_2f8[0].m_data[2] = true;
      local_2f8[0].m_data[3] = true;
      local_46c = (float)(pCVar9->m_size).m_data[0];
      tcu::TextureLevel::TextureLevel
                ((TextureLevel *)&comparePrec,&pCVar9->m_format,(int)local_46c,(int)local_46c,1);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&idealPix,(TextureLevel *)&comparePrec);
      tcu::Surface::Surface(&errorMask_1,(int)local_46c,(int)local_46c);
      tcu::Surface::getAccess((PixelBufferAccess *)offsets,&errorMask_1);
      viewportCoord.m_data[0] = -1.7146522e+38;
      tcu::RGBA::toVec((RGBA *)&viewportCoord);
      tcu::clear((PixelBufferAccess *)offsets,&resultPix);
      fVar13 = (float)(int)local_46c;
      fVar11 = 0.0;
      pSVar8 = (Surface *)0x0;
      if (0 < (int)local_46c) {
        pSVar8 = (Surface *)(ulong)(uint)local_46c;
      }
      local_458 = SUB84(pSVar8,0);
      local_460 = (uint)CONCAT71((uint7)(uint3)((uint)local_46c >> 8),1);
      for (; fVar11 != local_458; fVar11 = (float)((int)fVar11 + 1)) {
        local_454 = (float)(int)fVar11;
        for (fVar12 = 0.0; local_46c != fVar12; fVar12 = (float)((int)fVar12 + 1)) {
          offsets[2].m_data[0] = 0;
          offsets[2].m_data[1] = 0;
          offsets[3].m_data[0] = 0;
          offsets[3].m_data[1] = 0;
          offsets[0].m_data[0] = 0;
          offsets[0].m_data[1] = 0;
          offsets[1].m_data[0] = 0;
          offsets[1].m_data[1] = 0;
          resultPix.m_data[1] = fVar11;
          resultPix.m_data[0] = fVar12;
          (**pPVar5->_vptr_PixelOffsets)(pPVar5,(Texture2DView *)&resultPix,offsets);
          viewportCoord.m_data[0] = (float)(int)fVar12;
          viewportCoord.m_data[1] = local_454;
          tcu::operator+(0.5,(Vector<float,_2> *)&viewportCoord);
          texCoord.m_data[0] = fVar13;
          texCoord.m_data[1] = fVar13;
          tcu::operator/((Vector<float,_2> *)&resultPix,&texCoord);
          Functional::(anonymous_namespace)::triQuadInterpolate<tcu::Vector<float,2>>
                    ((_anonymous_namespace_ *)&errorMask,&texCoords,(float)ideal.m_width,
                     (float)ideal.m_height);
          tcu::ConstPixelBufferAccess::getPixelT<float>
                    ((ConstPixelBufferAccess *)&viewportCoord,(int)local_450,(int)fVar12,(int)fVar11
                    );
          tcu::Texture2DView::gatherOffsets
                    ((Texture2DView *)&resultPix,(Sampler *)local_360,(float)errorMask.m_width,
                     (float)errorMask.m_height,(int)&refColor,(IVec2 (*) [4])(ulong)(uint)local_45c)
          ;
          tcu::Vector<float,_4>::cast<float>((Vector<float,_4> *)&texCoord);
          pSVar8 = (Surface *)(ulong)(uint)fVar11;
          tcu::PixelBufferAccess::setPixel
                    ((PixelBufferAccess *)&idealPix,(Vector<float,_4> *)&texCoord,(int)fVar12,
                     (int)fVar11,0);
          tcu::absDiff<float,4>
                    ((tcu *)&resultPix,(Vector<float,_4> *)&viewportCoord,
                     (Vector<float,_4> *)&texCoord);
          tcu::Vector<float,_4>::cast<float>((Vector<float,_4> *)&local_428);
          tcu::greaterThan<float,4>
                    ((tcu *)&local_468,(Vector<float,_4> *)&resultPix,(Vector<float,_4> *)&local_428
                    );
          tcu::logicalAnd<bool,4>((tcu *)&local_464,local_2f8,&local_468);
          bVar6 = tcu::boolAny<4>(&local_464);
          if (bVar6) {
            pSVar8 = &errorMask;
            bVar6 = tcu::isGatherOffsetsResultValid
                              ((Texture2DView *)local_360,(Sampler *)&refColor,
                               (LookupPrecision *)&idealAccess,(Vec2 *)pSVar8,(int)local_45c,
                               &offsets,(Vec4 *)&viewportCoord);
            if (!bVar6) {
              *(undefined4 *)
               ((long)errorMask_1.m_pixels.m_ptr +
               (long)(errorMask_1.m_width * (int)fVar11 + (int)fVar12) * 4) = 0xff0000ff;
              local_460 = 0;
              pSVar8 = (Surface *)errorMask_1.m_pixels.m_ptr;
            }
          }
        }
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&viewportCoord,"VerifyResult",(allocator<char> *)&errorMask);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&texCoord,"Verification result",(allocator<char> *)&local_464);
      uVar10 = local_460;
      tcu::LogImageSet::LogImageSet
                ((LogImageSet *)&resultPix,(string *)&viewportCoord,(string *)&texCoord);
      tcu::LogImageSet::write((LogImageSet *)&resultPix,__fd,__buf_03,(size_t)pSVar8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_428,"Rendered",(allocator<char> *)&local_468);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ideal,"Rendered image",&local_46e);
      pCVar9 = local_450;
      tcu::LogImage::LogImage
                ((LogImage *)offsets,&local_428,(string *)&ideal,local_450,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)offsets,__fd,__buf_04,(size_t)pCVar9);
      tcu::LogImage::~LogImage((LogImage *)offsets);
      std::__cxx11::string::~string((string *)&ideal);
      std::__cxx11::string::~string((string *)&local_428);
      tcu::LogImageSet::~LogImageSet((LogImageSet *)&resultPix);
      std::__cxx11::string::~string((string *)&texCoord);
      std::__cxx11::string::~string((string *)&viewportCoord);
      if ((uVar10 & 1) == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&texCoord,"Reference",(allocator<char> *)&local_464);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_428,"Ideal reference image",(allocator<char> *)&local_468);
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)&viewportCoord,(TextureLevel *)&comparePrec);
        pCVar9 = (ConstPixelBufferAccess *)&viewportCoord;
        tcu::LogImage::LogImage
                  ((LogImage *)offsets,(string *)&texCoord,&local_428,pCVar9,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)offsets,__fd,__buf_05,(size_t)pCVar9);
        std::__cxx11::string::string<std::allocator<char>>((string *)&ideal,"ErrorMask",&local_46e);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&errorMask,"Error mask",&local_46d);
        pSVar8 = &errorMask_1;
        tcu::LogImage::LogImage
                  ((LogImage *)&resultPix,(string *)&ideal,(string *)&errorMask,pSVar8,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)&resultPix,__fd,__buf_06,(size_t)pSVar8);
        tcu::LogImage::~LogImage((LogImage *)&resultPix);
        std::__cxx11::string::~string((string *)&errorMask);
        std::__cxx11::string::~string((string *)&ideal);
        tcu::LogImage::~LogImage((LogImage *)offsets);
        std::__cxx11::string::~string((string *)&local_428);
        std::__cxx11::string::~string((string *)&texCoord);
      }
      tcu::TestLog::endImageSet((TestLog *)this_01);
    }
    else {
LAB_013748a4:
      if (2 < CVar3 - SIGNED_INT8) {
LAB_01374b96:
        uVar10 = 0;
        goto LAB_01374879;
      }
LAB_01373d03:
      tcu::IntLookupPrecision::IntLookupPrecision((IntLookupPrecision *)&idealAccess);
      tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)offsets,0);
      pPVar5 = local_2c8.
               super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
               .m_data.ptr;
      idealAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] = offsets[0].m_data[0];
      idealAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] = offsets[0].m_data[1];
      idealAccess.super_ConstPixelBufferAccess.m_data = (void *)offsets[1].m_data;
      idealAccess.super_ConstPixelBufferAccess.m_format.order = coordBits.m_data[0];
      idealAccess.super_ConstPixelBufferAccess.m_format.type = coordBits.m_data[1];
      idealAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = coordBits.m_data[2];
      idealAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] = uvwBits.m_data[2];
      idealAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = uvwBits.m_data[0];
      idealAccess.super_ConstPixelBufferAccess.m_size.m_data[2] = uvwBits.m_data[1];
      local_2f8[0].m_data[0] = true;
      local_2f8[0].m_data[1] = true;
      local_2f8[0].m_data[2] = true;
      local_2f8[0].m_data[3] = true;
      CVar3 = (this->super_TextureGatherCase).m_textureFormat.type;
      if (((ulong)CVar3 < 0x22) && ((0x2c0000000U >> ((ulong)CVar3 & 0x3f) & 1) != 0)) {
        local_46c = (float)(local_450->m_size).m_data[0];
        tcu::TextureLevel::TextureLevel
                  ((TextureLevel *)&comparePrec,&local_450->m_format,(int)local_46c,(int)local_46c,1
                  );
        tcu::TextureLevel::getAccess((PixelBufferAccess *)&idealPix,(TextureLevel *)&comparePrec);
        tcu::Surface::Surface(&errorMask_1,(int)local_46c,(int)local_46c);
        tcu::Surface::getAccess((PixelBufferAccess *)offsets,&errorMask_1);
        viewportCoord.m_data[0] = -1.7146522e+38;
        tcu::RGBA::toVec((RGBA *)&viewportCoord);
        tcu::clear((PixelBufferAccess *)offsets,&resultPix);
        fVar13 = (float)(int)local_46c;
        fVar11 = 0.0;
        pSVar8 = (Surface *)0x0;
        if (0 < (int)local_46c) {
          pSVar8 = (Surface *)(ulong)(uint)local_46c;
        }
        local_458 = SUB84(pSVar8,0);
        local_460 = (uint)CONCAT71((uint7)(uint3)((uint)local_46c >> 8),1);
        for (; fVar11 != local_458; fVar11 = (float)((int)fVar11 + 1)) {
          local_454 = (float)(int)fVar11;
          for (fVar12 = 0.0; local_46c != fVar12; fVar12 = (float)((int)fVar12 + 1)) {
            offsets[2].m_data[0] = 0;
            offsets[2].m_data[1] = 0;
            offsets[3].m_data[0] = 0;
            offsets[3].m_data[1] = 0;
            offsets[0].m_data[0] = 0;
            offsets[0].m_data[1] = 0;
            offsets[1].m_data[0] = 0;
            offsets[1].m_data[1] = 0;
            resultPix.m_data[1] = fVar11;
            resultPix.m_data[0] = fVar12;
            (**pPVar5->_vptr_PixelOffsets)(pPVar5,(Texture2DView *)&resultPix,offsets);
            viewportCoord.m_data[0] = (float)(int)fVar12;
            viewportCoord.m_data[1] = local_454;
            tcu::operator+(0.5,(Vector<float,_2> *)&viewportCoord);
            texCoord.m_data[0] = fVar13;
            texCoord.m_data[1] = fVar13;
            tcu::operator/((Vector<float,_2> *)&resultPix,&texCoord);
            Functional::(anonymous_namespace)::triQuadInterpolate<tcu::Vector<float,2>>
                      ((_anonymous_namespace_ *)&errorMask,&texCoords,(float)ideal.m_width,
                       (float)ideal.m_height);
            tcu::ConstPixelBufferAccess::getPixelT<unsigned_int>
                      ((ConstPixelBufferAccess *)&viewportCoord,(int)local_450,(int)fVar12,
                       (int)fVar11);
            tcu::Texture2DView::gatherOffsets
                      ((Texture2DView *)&resultPix,(Sampler *)local_360,(float)errorMask.m_width,
                       (float)errorMask.m_height,(int)&refColor,
                       (IVec2 (*) [4])(ulong)(uint)local_45c);
            tcu::Vector<float,_4>::cast<unsigned_int>((Vector<float,_4> *)&texCoord);
            pSVar8 = (Surface *)(ulong)(uint)fVar11;
            tcu::PixelBufferAccess::setPixel
                      ((PixelBufferAccess *)&idealPix,(UVec4 *)&texCoord,(int)fVar12,(int)fVar11,0);
            tcu::absDiff<unsigned_int,4>
                      ((tcu *)&resultPix,(Vector<unsigned_int,_4> *)&viewportCoord,
                       (Vector<unsigned_int,_4> *)&texCoord);
            tcu::Vector<unsigned_int,_4>::cast<unsigned_int>((Vector<unsigned_int,_4> *)&local_428);
            tcu::greaterThan<unsigned_int,4>
                      ((tcu *)&local_468,(Vector<unsigned_int,_4> *)&resultPix,
                       (Vector<unsigned_int,_4> *)&local_428);
            tcu::logicalAnd<bool,4>((tcu *)&local_464,local_2f8,&local_468);
            bVar6 = tcu::boolAny<4>(&local_464);
            if (bVar6) {
              pSVar8 = &errorMask;
              bVar6 = tcu::isGatherOffsetsResultValid
                                ((Texture2DView *)local_360,(Sampler *)&refColor,
                                 (IntLookupPrecision *)&idealAccess,(Vec2 *)pSVar8,(int)local_45c,
                                 &offsets,(UVec4 *)&viewportCoord);
              if (!bVar6) {
                *(undefined4 *)
                 ((long)errorMask_1.m_pixels.m_ptr +
                 (long)(errorMask_1.m_width * (int)fVar11 + (int)fVar12) * 4) = 0xff0000ff;
                local_460 = 0;
                pSVar8 = (Surface *)errorMask_1.m_pixels.m_ptr;
              }
            }
          }
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&viewportCoord,"VerifyResult",(allocator<char> *)&errorMask);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&texCoord,"Verification result",(allocator<char> *)&local_464);
        uVar10 = local_460;
        tcu::LogImageSet::LogImageSet
                  ((LogImageSet *)&resultPix,(string *)&viewportCoord,(string *)&texCoord);
        tcu::LogImageSet::write((LogImageSet *)&resultPix,__fd,__buf_07,(size_t)pSVar8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_428,"Rendered",(allocator<char> *)&local_468);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&ideal,"Rendered image",&local_46e);
        pCVar9 = local_450;
        tcu::LogImage::LogImage
                  ((LogImage *)offsets,&local_428,(string *)&ideal,local_450,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)offsets,__fd,__buf_08,(size_t)pCVar9);
        tcu::LogImage::~LogImage((LogImage *)offsets);
        std::__cxx11::string::~string((string *)&ideal);
        std::__cxx11::string::~string((string *)&local_428);
        tcu::LogImageSet::~LogImageSet((LogImageSet *)&resultPix);
        std::__cxx11::string::~string((string *)&texCoord);
        std::__cxx11::string::~string((string *)&viewportCoord);
        if ((uVar10 & 1) == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&texCoord,"Reference",(allocator<char> *)&local_464);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_428,"Ideal reference image",(allocator<char> *)&local_468);
          tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                    ((ConstPixelBufferAccess *)&viewportCoord,(TextureLevel *)&comparePrec);
          pCVar9 = (ConstPixelBufferAccess *)&viewportCoord;
          tcu::LogImage::LogImage
                    ((LogImage *)offsets,(string *)&texCoord,&local_428,pCVar9,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write((LogImage *)offsets,__fd,__buf_09,(size_t)pCVar9);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&ideal,"ErrorMask",&local_46e);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&errorMask,"Error mask",&local_46d);
          pSVar8 = &errorMask_1;
          tcu::LogImage::LogImage
                    ((LogImage *)&resultPix,(string *)&ideal,(string *)&errorMask,pSVar8,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write((LogImage *)&resultPix,__fd,__buf_10,(size_t)pSVar8);
          tcu::LogImage::~LogImage((LogImage *)&resultPix);
          std::__cxx11::string::~string((string *)&errorMask);
          std::__cxx11::string::~string((string *)&ideal);
          tcu::LogImage::~LogImage((LogImage *)offsets);
          std::__cxx11::string::~string((string *)&local_428);
          std::__cxx11::string::~string((string *)&texCoord);
        }
        tcu::TestLog::endImageSet((TestLog *)this_01);
      }
      else {
        if (2 < CVar3 - SIGNED_INT8) goto LAB_01374b96;
        local_46c = (float)(local_450->m_size).m_data[0];
        tcu::TextureLevel::TextureLevel
                  ((TextureLevel *)&comparePrec,&local_450->m_format,(int)local_46c,(int)local_46c,1
                  );
        tcu::TextureLevel::getAccess((PixelBufferAccess *)&idealPix,(TextureLevel *)&comparePrec);
        tcu::Surface::Surface(&errorMask_1,(int)local_46c,(int)local_46c);
        tcu::Surface::getAccess((PixelBufferAccess *)offsets,&errorMask_1);
        viewportCoord.m_data[0] = -1.7146522e+38;
        tcu::RGBA::toVec((RGBA *)&viewportCoord);
        tcu::clear((PixelBufferAccess *)offsets,&resultPix);
        fVar13 = (float)(int)local_46c;
        fVar11 = 0.0;
        pSVar8 = (Surface *)0x0;
        if (0 < (int)local_46c) {
          pSVar8 = (Surface *)(ulong)(uint)local_46c;
        }
        local_458 = SUB84(pSVar8,0);
        local_460 = (uint)CONCAT71((uint7)(uint3)((uint)local_46c >> 8),1);
        for (; fVar11 != local_458; fVar11 = (float)((int)fVar11 + 1)) {
          local_454 = (float)(int)fVar11;
          for (fVar12 = 0.0; local_46c != fVar12; fVar12 = (float)((int)fVar12 + 1)) {
            offsets[2].m_data[0] = 0;
            offsets[2].m_data[1] = 0;
            offsets[3].m_data[0] = 0;
            offsets[3].m_data[1] = 0;
            offsets[0].m_data[0] = 0;
            offsets[0].m_data[1] = 0;
            offsets[1].m_data[0] = 0;
            offsets[1].m_data[1] = 0;
            resultPix.m_data[1] = fVar11;
            resultPix.m_data[0] = fVar12;
            (**pPVar5->_vptr_PixelOffsets)(pPVar5,(Texture2DView *)&resultPix,offsets);
            viewportCoord.m_data[0] = (float)(int)fVar12;
            viewportCoord.m_data[1] = local_454;
            tcu::operator+(0.5,(Vector<float,_2> *)&viewportCoord);
            texCoord.m_data[0] = fVar13;
            texCoord.m_data[1] = fVar13;
            tcu::operator/((Vector<float,_2> *)&resultPix,&texCoord);
            Functional::(anonymous_namespace)::triQuadInterpolate<tcu::Vector<float,2>>
                      ((_anonymous_namespace_ *)&errorMask,&texCoords,(float)ideal.m_width,
                       (float)ideal.m_height);
            tcu::ConstPixelBufferAccess::getPixelT<int>
                      ((ConstPixelBufferAccess *)&viewportCoord,(int)local_450,(int)fVar12,
                       (int)fVar11);
            tcu::Texture2DView::gatherOffsets
                      ((Texture2DView *)&resultPix,(Sampler *)local_360,(float)errorMask.m_width,
                       (float)errorMask.m_height,(int)&refColor,
                       (IVec2 (*) [4])(ulong)(uint)local_45c);
            tcu::Vector<float,_4>::cast<int>((Vector<float,_4> *)&texCoord);
            pSVar8 = (Surface *)(ulong)(uint)fVar11;
            tcu::PixelBufferAccess::setPixel
                      ((PixelBufferAccess *)&idealPix,(IVec4 *)&texCoord,(int)fVar12,(int)fVar11,0);
            tcu::absDiff<int,4>((tcu *)&resultPix,(Vector<int,_4> *)&viewportCoord,
                                (Vector<int,_4> *)&texCoord);
            tcu::Vector<unsigned_int,_4>::cast<int>((Vector<unsigned_int,_4> *)&local_428);
            tcu::greaterThan<int,4>
                      ((tcu *)&local_468,(Vector<int,_4> *)&resultPix,(Vector<int,_4> *)&local_428);
            tcu::logicalAnd<bool,4>((tcu *)&local_464,local_2f8,&local_468);
            bVar6 = tcu::boolAny<4>(&local_464);
            if (bVar6) {
              pSVar8 = &errorMask;
              bVar6 = tcu::isGatherOffsetsResultValid
                                ((Texture2DView *)local_360,(Sampler *)&refColor,
                                 (IntLookupPrecision *)&idealAccess,(Vec2 *)pSVar8,(int)local_45c,
                                 &offsets,(IVec4 *)&viewportCoord);
              if (!bVar6) {
                *(undefined4 *)
                 ((long)errorMask_1.m_pixels.m_ptr +
                 (long)(errorMask_1.m_width * (int)fVar11 + (int)fVar12) * 4) = 0xff0000ff;
                local_460 = 0;
                pSVar8 = (Surface *)errorMask_1.m_pixels.m_ptr;
              }
            }
          }
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&viewportCoord,"VerifyResult",(allocator<char> *)&errorMask);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&texCoord,"Verification result",(allocator<char> *)&local_464);
        uVar10 = local_460;
        tcu::LogImageSet::LogImageSet
                  ((LogImageSet *)&resultPix,(string *)&viewportCoord,(string *)&texCoord);
        tcu::LogImageSet::write((LogImageSet *)&resultPix,__fd,__buf_11,(size_t)pSVar8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_428,"Rendered",(allocator<char> *)&local_468);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&ideal,"Rendered image",&local_46e);
        pCVar9 = local_450;
        tcu::LogImage::LogImage
                  ((LogImage *)offsets,&local_428,(string *)&ideal,local_450,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)offsets,__fd,__buf_12,(size_t)pCVar9);
        tcu::LogImage::~LogImage((LogImage *)offsets);
        std::__cxx11::string::~string((string *)&ideal);
        std::__cxx11::string::~string((string *)&local_428);
        tcu::LogImageSet::~LogImageSet((LogImageSet *)&resultPix);
        std::__cxx11::string::~string((string *)&texCoord);
        std::__cxx11::string::~string((string *)&viewportCoord);
        if ((uVar10 & 1) == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&texCoord,"Reference",(allocator<char> *)&local_464);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_428,"Ideal reference image",(allocator<char> *)&local_468);
          tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                    ((ConstPixelBufferAccess *)&viewportCoord,(TextureLevel *)&comparePrec);
          pCVar9 = (ConstPixelBufferAccess *)&viewportCoord;
          tcu::LogImage::LogImage
                    ((LogImage *)offsets,(string *)&texCoord,&local_428,pCVar9,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write((LogImage *)offsets,__fd,__buf_13,(size_t)pCVar9);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&ideal,"ErrorMask",&local_46e);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&errorMask,"Error mask",&local_46d);
          pSVar8 = &errorMask_1;
          tcu::LogImage::LogImage
                    ((LogImage *)&resultPix,(string *)&ideal,(string *)&errorMask,pSVar8,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write((LogImage *)&resultPix,__fd,__buf_14,(size_t)pSVar8);
          tcu::LogImage::~LogImage((LogImage *)&resultPix);
          std::__cxx11::string::~string((string *)&errorMask);
          std::__cxx11::string::~string((string *)&ideal);
          tcu::LogImage::~LogImage((LogImage *)offsets);
          std::__cxx11::string::~string((string *)&local_428);
          std::__cxx11::string::~string((string *)&texCoord);
        }
        tcu::TestLog::endImageSet((TestLog *)this_01);
      }
    }
    tcu::Surface::~Surface(&errorMask_1);
    tcu::TextureLevel::~TextureLevel((TextureLevel *)&comparePrec);
  }
LAB_01374879:
  if (local_2c8.
      super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
      .m_data.ptr != (PixelOffsets *)0x0) {
    (*(local_2c8.
       super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
       .m_data.ptr)->_vptr_PixelOffsets[2])();
  }
LAB_0137488c:
  return uVar10 & 0xffffff01;
}

Assistant:

bool TextureGather2DCase::verify (int iterationNdx, const ConstPixelBufferAccess& rendered) const
{
	Vec2 texCoords[4];
	computeTexCoordVecs(computeQuadTexCoord(iterationNdx), texCoords);
	return TextureGatherCase::verify(rendered, getOneLevelSubView(tcu::Texture2DView(m_swizzledTexture), m_baseLevel), texCoords, m_iterations[iterationNdx]);
}